

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_wrapper.cpp
# Opt level: O0

void __thiscall
duckdb::ResultArrowArrayStreamWrapper::ResultArrowArrayStreamWrapper
          (ResultArrowArrayStreamWrapper *this,
          unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *result_p,
          idx_t batch_size_p)

{
  runtime_error *this_00;
  ClientContext *this_01;
  pointer pQVar1;
  long in_RDX;
  undefined8 *in_RDI;
  vector<duckdb::LogicalType,_true> *in_stack_00000090;
  ClientContext *in_stack_00000098;
  unique_ptr<duckdb::QueryResultChunkScanState,_std::default_delete<duckdb::QueryResultChunkScanState>_>
  *in_stack_ffffffffffffff38;
  ErrorData *in_stack_ffffffffffffff40;
  QueryResult *in_stack_ffffffffffffff58;
  
  unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::unique_ptr
            ((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
             in_stack_ffffffffffffff40,
             (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
             in_stack_ffffffffffffff38);
  ErrorData::ErrorData(in_stack_ffffffffffffff40);
  vector<duckdb::LogicalType,_true>::vector((vector<duckdb::LogicalType,_true> *)0x15297f5);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *)0x152980b);
  unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::operator*
            ((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
             in_stack_ffffffffffffff40);
  make_uniq<duckdb::QueryResultChunkScanState,duckdb::QueryResult&>(in_stack_ffffffffffffff58);
  unique_ptr<duckdb::ChunkScanState,std::default_delete<duckdb::ChunkScanState>,true>::
  unique_ptr<duckdb::QueryResultChunkScanState,std::default_delete<std::unique_ptr<duckdb::ChunkScanState,std::default_delete<duckdb::ChunkScanState>>>,void>
            ((unique_ptr<duckdb::ChunkScanState,_std::default_delete<duckdb::ChunkScanState>,_true>
              *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  unique_ptr<duckdb::QueryResultChunkScanState,_std::default_delete<duckdb::QueryResultChunkScanState>,_true>
  ::~unique_ptr((unique_ptr<duckdb::QueryResultChunkScanState,_std::default_delete<duckdb::QueryResultChunkScanState>,_true>
                 *)0x1529861);
  ::std::
  unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
  ::unordered_map((unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
                   *)0x1529877);
  in_RDI[4] = in_RDI;
  if (in_RDX == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error
              (this_00,"Approximate Batch Size of Record Batch MUST be higher than 0");
    __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  in_RDI[0x16] = in_RDX;
  *in_RDI = MyStreamGetSchema;
  in_RDI[1] = MyStreamGetNext;
  in_RDI[3] = MyStreamRelease;
  in_RDI[2] = MyStreamGetLastError;
  unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::operator->
            ((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
             in_stack_ffffffffffffff40);
  this_01 = optional_ptr<duckdb::ClientContext,_true>::operator*
                      ((optional_ptr<duckdb::ClientContext,_true> *)in_stack_ffffffffffffff40);
  pQVar1 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
           operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                       *)this_01);
  ArrowTypeExtensionData::GetExtensionTypes(in_stack_00000098,in_stack_00000090);
  ::std::
  unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
  ::operator=((unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
               *)this_01,
              (unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
               *)pQVar1);
  ::std::
  unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
  ::~unordered_map((unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
                    *)0x15299f4);
  return;
}

Assistant:

ResultArrowArrayStreamWrapper::ResultArrowArrayStreamWrapper(unique_ptr<QueryResult> result_p, idx_t batch_size_p)
    : result(std::move(result_p)), scan_state(make_uniq<QueryResultChunkScanState>(*result)) {
	//! We first initialize the private data of the stream
	stream.private_data = this;
	//! Ceil Approx_Batch_Size/STANDARD_VECTOR_SIZE
	if (batch_size_p == 0) {
		throw std::runtime_error("Approximate Batch Size of Record Batch MUST be higher than 0");
	}
	batch_size = batch_size_p;
	//! We initialize the stream functions
	stream.get_schema = ResultArrowArrayStreamWrapper::MyStreamGetSchema;
	stream.get_next = ResultArrowArrayStreamWrapper::MyStreamGetNext;
	stream.release = ResultArrowArrayStreamWrapper::MyStreamRelease;
	stream.get_last_error = ResultArrowArrayStreamWrapper::MyStreamGetLastError;

	extension_types =
	    ArrowTypeExtensionData::GetExtensionTypes(*result->client_properties.client_context, result->types);
}